

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

void __thiscall IR::Instr::DumpRange(Instr *this,Instr *instrEnd)

{
  Instr **ppIVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Instr *pIVar5;
  Instr *pIVar6;
  
  pIVar5 = (Instr *)0x0;
  Output::Print(L"-------------------------------------------------------------------------------\n"
               );
  if ((instrEnd == (Instr *)0x0) || (pIVar5 = instrEnd->m_next, pIVar5 != this)) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    pIVar6 = (Instr *)0x0;
    do {
      if ((pIVar6 != (Instr *)0x0) && (pIVar6->m_next != this)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                           ,0x1320,
                           "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                           "Modifying instr list but not using EDITING iterator!");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
      (**this->_vptr_Instr)(this,0);
      ppIVar1 = &this->m_next;
      pIVar6 = this;
      this = *ppIVar1;
    } while (*ppIVar1 != pIVar5);
  }
  Output::Print(L"-------------------------------------------------------------------------------\n"
               );
  return;
}

Assistant:

void
Instr::DumpRange(Instr *instrEnd)
{
    Output::Print(_u("-------------------------------------------------------------------------------\n"));

    FOREACH_INSTR_IN_RANGE(instr, this, instrEnd)
    {
        instr->Dump();
    }
    NEXT_INSTR_IN_RANGE;

    Output::Print(_u("-------------------------------------------------------------------------------\n"));
}